

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Cube::setupLeftFace(Cube *this)

{
  float fVar1;
  undefined4 uVar2;
  float fVar3;
  undefined4 uVar4;
  int i;
  long lVar5;
  float fVar6;
  float fVar7;
  float leftFace [18];
  
  leftFace[0] = this->x;
  leftFace[3] = leftFace[0];
  leftFace[6] = leftFace[0];
  fVar1 = this->y;
  fVar3 = this->z;
  leftFace[1] = fVar1;
  leftFace[2] = fVar3;
  uVar2 = this->b;
  uVar4 = this->h;
  fVar6 = (float)uVar4 + fVar1;
  fVar7 = (float)uVar2 + fVar3;
  leftFace[4] = fVar6;
  leftFace[5] = fVar3;
  leftFace[7] = fVar6;
  leftFace[8] = fVar7;
  leftFace[9] = leftFace[0];
  leftFace[10] = fVar1;
  leftFace[0xb] = fVar3;
  leftFace[0xc] = leftFace[0];
  leftFace[0xd] = fVar6;
  leftFace[0xe] = fVar7;
  leftFace[0xf] = leftFace[0];
  leftFace[0x10] = fVar1;
  leftFace[0x11] = fVar7;
  for (lVar5 = 0; lVar5 != 0x12; lVar5 = lVar5 + 1) {
    this->positionData[lVar5 + 0x24] = leftFace[lVar5];
  }
  return;
}

Assistant:

void setupLeftFace() {
        float leftFace[]={
            x,y,z,

            x,y+h,z,
            x,y+h,z+b,
            x,y,z,
            x,y+h,z+b,
            x,y,z+b
        };
        arrayCopy(leftFace,positionData,36);
    }